

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCVS.cxx
# Opt level: O2

void __thiscall
cmCTestCVS::LoadRevisions
          (cmCTestCVS *this,string *file,char *branchFlag,
          vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_> *revisions)

{
  cmCTest *this_00;
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_8b3;
  allocator<char> local_8b2;
  allocator<char> local_8b1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cvs_log;
  OutputLogger err;
  string local_858;
  string cvs;
  LogParser out;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
  std::operator<<((ostream *)&out,".");
  std::ostream::flush();
  this_00 = (this->super_cmCTestVC).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_00,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCVS.cxx"
               ,0xdb,(char *)err.super_LineParser.super_OutputParser._vptr_OutputParser,false);
  std::__cxx11::string::~string((string *)&err);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
  std::__cxx11::string::string((string *)&cvs,(string *)&(this->super_cmCTestVC).CommandLineTool);
  std::__cxx11::string::string((string *)&out,(string *)&cvs);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out.super_LineParser.Line._M_string_length,"log",(allocator<char> *)&err);
  std::__cxx11::string::string<std::allocator<char>>((string *)&out.CVS,"-N",&local_8b1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(out.RegexRevision.regmatch.startp + 2),branchFlag,&local_8b2);
  std::__cxx11::string::string((string *)(out.RegexRevision.regmatch.startp + 6),(string *)file);
  __l._M_len = 5;
  __l._M_array = (iterator)&out;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&cvs_log,__l,&local_8b3);
  lVar1 = 0x80;
  do {
    std::__cxx11::string::~string
              ((string *)((long)out.RegexRevision.regmatch.startp + lVar1 + -0x50));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  LogParser::LogParser(&out,this,"log-out> ",revisions);
  cmProcessTools::OutputLogger::OutputLogger(&err,(this->super_cmCTestVC).Log,"log-err> ");
  local_858._M_dataplus._M_p = (pointer)&local_858.field_2;
  local_858._M_string_length = 0;
  local_858.field_2._M_local_buf[0] = '\0';
  cmCTestVC::RunChild(&this->super_cmCTestVC,&cvs_log,(OutputParser *)&out,(OutputParser *)&err,
                      &local_858,Auto);
  std::__cxx11::string::~string((string *)&local_858);
  cmProcessTools::LineParser::~LineParser(&err.super_LineParser);
  LogParser::~LogParser(&out);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&cvs_log);
  std::__cxx11::string::~string((string *)&cvs);
  return;
}

Assistant:

void cmCTestCVS::LoadRevisions(std::string const& file, const char* branchFlag,
                               std::vector<Revision>& revisions)
{
  cmCTestLog(this->CTest, HANDLER_OUTPUT, "." << std::flush);

  // Run "cvs log" to get revisions of this file on this branch.
  std::string cvs = this->CommandLineTool;
  std::vector<std::string> cvs_log = { cvs, "log", "-N", branchFlag, file };

  LogParser out(this, "log-out> ", revisions);
  OutputLogger err(this->Log, "log-err> ");
  this->RunChild(cvs_log, &out, &err);
}